

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall Assimp::OpenGEX::OpenGEXImporter::copyLights(OpenGEXImporter *this,aiScene *pScene)

{
  pointer ppaVar1;
  pointer ppaVar2;
  ulong uVar3;
  aiLight **__dest;
  size_t __n;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x499,"void Assimp::OpenGEX::OpenGEXImporter::copyLights(aiScene *)");
  }
  ppaVar1 = (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar2 = (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppaVar1 != ppaVar2) {
    uVar3 = (long)ppaVar2 - (long)ppaVar1;
    pScene->mNumLights = (uint)(uVar3 >> 3);
    __dest = (aiLight **)operator_new__(uVar3 & 0x7fffffff8);
    pScene->mLights = __dest;
    ppaVar1 = (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    __n = (long)(this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar1;
    if (__n != 0) {
      memmove(__dest,ppaVar1,__n);
      return;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::copyLights( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_lightCache.empty() ) {
        return;
    }

    pScene->mNumLights = static_cast<unsigned int>(m_lightCache.size());
    pScene->mLights = new aiLight*[ pScene->mNumLights ];
    std::copy( m_lightCache.begin(), m_lightCache.end(), pScene->mLights );
}